

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

char * concat_url(char *base,char *relurl)

{
  char *pcVar1;
  char cVar2;
  CURLcode CVar3;
  char *sep;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  size_t len;
  char *pcVar7;
  _Bool relative;
  int iVar8;
  char cVar9;
  dynbuf newest;
  dynbuf local_50;
  
  pcVar4 = strstr(base,"//");
  pcVar7 = pcVar4 + 2;
  if (pcVar4 == (char *)0x0) {
    pcVar7 = base;
  }
  cVar2 = *relurl;
  if (cVar2 == '/') {
    if (relurl[1] == '/') {
      *pcVar7 = '\0';
      relurl = relurl + 2;
      relative = false;
    }
    else {
      pcVar4 = strchr(pcVar7,0x2f);
      pcVar6 = strchr(pcVar7,0x3f);
      if (pcVar4 == (char *)0x0) {
        relative = true;
        if (pcVar6 != (char *)0x0) {
          *pcVar6 = '\0';
        }
      }
      else {
        pcVar5 = pcVar4;
        if (pcVar6 < pcVar4) {
          pcVar5 = pcVar6;
        }
        if (pcVar6 == (char *)0x0) {
          pcVar5 = pcVar4;
        }
        *pcVar5 = '\0';
        relative = true;
      }
    }
  }
  else {
    pcVar4 = strchr(pcVar7,0x3f);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
      cVar2 = *relurl;
    }
    cVar9 = '?';
    if ((cVar2 != '?') && (pcVar4 = strrchr(pcVar7,0x2f), cVar9 = cVar2, pcVar4 != (char *)0x0)) {
      *pcVar4 = '\0';
      cVar9 = *relurl;
    }
    pcVar5 = strchr(pcVar7,0x2f);
    pcVar4 = pcVar5 + 1;
    pcVar6 = pcVar4;
    if (pcVar5 == (char *)0x0) {
      pcVar6 = (char *)0x0;
    }
    iVar8 = 0;
    if ((cVar9 == '.') && (relurl = relurl + (ulong)(relurl[1] == '/') * 2, *relurl == '.')) {
      iVar8 = 0;
      pcVar7 = relurl;
      do {
        relurl = pcVar7;
        if ((pcVar7[1] != '.') || (pcVar7[2] != '/')) break;
        iVar8 = iVar8 + 1;
        relurl = pcVar7 + 3;
        pcVar1 = pcVar7 + 3;
        pcVar7 = relurl;
      } while (*pcVar1 == '.');
    }
    relative = true;
    pcVar7 = pcVar4;
    if (pcVar5 == (char *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      for (; iVar8 != 0; iVar8 = iVar8 + -1) {
        pcVar7 = strrchr(pcVar6,0x2f);
        if (pcVar7 == (char *)0x0) {
          *pcVar6 = '\0';
          pcVar7 = pcVar4;
          break;
        }
        *pcVar7 = '\0';
        pcVar7 = pcVar6;
      }
    }
  }
  Curl_dyn_init(&local_50,8000000);
  CVar3 = Curl_dyn_add(&local_50,base);
  if (CVar3 == CURLE_OK) {
    cVar2 = *relurl;
    if (cVar2 != '/') {
      if (pcVar7 == (char *)0x0) {
        if (cVar2 != '?') goto LAB_005ed41c;
      }
      else if ((cVar2 != '?') && (*pcVar7 != '\0')) {
LAB_005ed41c:
        CVar3 = Curl_dyn_addn(&local_50,"/",1);
        if (CVar3 != CURLE_OK) goto LAB_005ed3b4;
      }
    }
    len = strlen(relurl);
    urlencode_str(&local_50,relurl,len,relative,false);
    pcVar7 = Curl_dyn_ptr(&local_50);
  }
  else {
LAB_005ed3b4:
    pcVar7 = (char *)0x0;
  }
  return pcVar7;
}

Assistant:

static char *concat_url(char *base, const char *relurl)
{
  /***
   TRY to append this new path to the old URL
   to the right of the host part. Oh crap, this is doomed to cause
   problems in the future...
  */
  struct dynbuf newest;
  char *protsep;
  char *pathsep;
  bool host_changed = FALSE;
  const char *useurl = relurl;

  /* protsep points to the start of the host name */
  protsep = strstr(base, "//");
  if(!protsep)
    protsep = base;
  else
    protsep += 2; /* pass the slashes */

  if('/' != relurl[0]) {
    int level = 0;

    /* First we need to find out if there's a ?-letter in the URL,
       and cut it and the right-side of that off */
    pathsep = strchr(protsep, '?');
    if(pathsep)
      *pathsep = 0;

    /* we have a relative path to append to the last slash if there's one
       available, or if the new URL is just a query string (starts with a
       '?')  we append the new one at the end of the entire currently worked
       out URL */
    if(useurl[0] != '?') {
      pathsep = strrchr(protsep, '/');
      if(pathsep)
        *pathsep = 0;
    }

    /* Check if there's any slash after the host name, and if so, remember
       that position instead */
    pathsep = strchr(protsep, '/');
    if(pathsep)
      protsep = pathsep + 1;
    else
      protsep = NULL;

    /* now deal with one "./" or any amount of "../" in the newurl
       and act accordingly */

    if((useurl[0] == '.') && (useurl[1] == '/'))
      useurl += 2; /* just skip the "./" */

    while((useurl[0] == '.') &&
          (useurl[1] == '.') &&
          (useurl[2] == '/')) {
      level++;
      useurl += 3; /* pass the "../" */
    }

    if(protsep) {
      while(level--) {
        /* cut off one more level from the right of the original URL */
        pathsep = strrchr(protsep, '/');
        if(pathsep)
          *pathsep = 0;
        else {
          *protsep = 0;
          break;
        }
      }
    }
  }
  else {
    /* We got a new absolute path for this server */

    if(relurl[1] == '/') {
      /* the new URL starts with //, just keep the protocol part from the
         original one */
      *protsep = 0;
      useurl = &relurl[2]; /* we keep the slashes from the original, so we
                              skip the new ones */
      host_changed = TRUE;
    }
    else {
      /* cut off the original URL from the first slash, or deal with URLs
         without slash */
      pathsep = strchr(protsep, '/');
      if(pathsep) {
        /* When people use badly formatted URLs, such as
           "http://www.url.com?dir=/home/daniel" we must not use the first
           slash, if there's a ?-letter before it! */
        char *sep = strchr(protsep, '?');
        if(sep && (sep < pathsep))
          pathsep = sep;
        *pathsep = 0;
      }
      else {
        /* There was no slash. Now, since we might be operating on a badly
           formatted URL, such as "http://www.url.com?id=2380" which doesn't
           use a slash separator as it is supposed to, we need to check for a
           ?-letter as well! */
        pathsep = strchr(protsep, '?');
        if(pathsep)
          *pathsep = 0;
      }
    }
  }

  Curl_dyn_init(&newest, CURL_MAX_INPUT_LENGTH);

  /* copy over the root url part */
  if(Curl_dyn_add(&newest, base))
    return NULL;

  /* check if we need to append a slash */
  if(('/' == useurl[0]) || (protsep && !*protsep) || ('?' == useurl[0]))
    ;
  else {
    if(Curl_dyn_addn(&newest, "/", 1))
      return NULL;
  }

  /* then append the new piece on the right side */
  urlencode_str(&newest, useurl, strlen(useurl), !host_changed, FALSE);

  return Curl_dyn_ptr(&newest);
}